

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_core.c
# Opt level: O0

int ossl_provider_deactivate(OSSL_PROVIDER *prov,int removechildren)

{
  int iVar1;
  uint in_ESI;
  long in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  OSSL_PROVIDER *in_stack_00000008;
  int count;
  int local_1c;
  
  if ((in_RDI != 0) &&
     (iVar1 = provider_deactivate(in_stack_00000008,unaff_retaddr_00,unaff_retaddr), -1 < iVar1)) {
    if (iVar1 == 0) {
      local_1c = provider_flush_store_cache((OSSL_PROVIDER *)((ulong)in_ESI << 0x20));
    }
    else {
      local_1c = 1;
    }
    return local_1c;
  }
  return 0;
}

Assistant:

int ossl_provider_deactivate(OSSL_PROVIDER *prov, int removechildren)
{
    int count;

    if (prov == NULL
            || (count = provider_deactivate(prov, 1, removechildren)) < 0)
        return 0;
    return count == 0 ? provider_flush_store_cache(prov) : 1;
}